

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.h
# Opt level: O0

int is_frame_droppable(RTC_REF *rtc_ref,ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags)

{
  byte local_19;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags_local;
  RTC_REF *rtc_ref_local;
  uint local_4;
  
  if (rtc_ref->set_ref_frame_config == 0) {
    if ((ext_refresh_frame_flags->update_pending & 1U) == 0) {
      local_4 = 0;
    }
    else {
      local_19 = 1;
      if (((((ext_refresh_frame_flags->alt_ref_frame & 1U) == 0) &&
           (local_19 = 1, (ext_refresh_frame_flags->alt2_ref_frame & 1U) == 0)) &&
          (local_19 = 1, (ext_refresh_frame_flags->bwd_ref_frame & 1U) == 0)) &&
         (local_19 = 1, (ext_refresh_frame_flags->golden_frame & 1U) == 0)) {
        local_19 = ext_refresh_frame_flags->last_frame;
      }
      local_4 = (uint)((local_19 ^ 0xff) & 1);
    }
  }
  else {
    local_4 = rtc_ref->non_reference_frame;
  }
  return local_4;
}

Assistant:

static inline int is_frame_droppable(
    const RTC_REF *const rtc_ref,
    const ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags) {
  // Droppable frame is only used by external refresh flags. VoD setting won't
  // trigger its use case.
  if (rtc_ref->set_ref_frame_config)
    return rtc_ref->non_reference_frame;
  else if (ext_refresh_frame_flags->update_pending)
    return !(ext_refresh_frame_flags->alt_ref_frame ||
             ext_refresh_frame_flags->alt2_ref_frame ||
             ext_refresh_frame_flags->bwd_ref_frame ||
             ext_refresh_frame_flags->golden_frame ||
             ext_refresh_frame_flags->last_frame);
  else
    return 0;
}